

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O2

var __thiscall cs::runtime_type::parse_expr(runtime_type *this,iterator *it,bool disable_parallel)

{
  token_base *ptVar1;
  _func_int **pp_Var2;
  anon_struct_8_0_00000001_for___align aVar3;
  slot_type *psVar4;
  undefined8 uVar5;
  int iVar6;
  token_base **pptVar7;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *pdVar8;
  var *pvVar9;
  proxy *ppVar10;
  iterator b;
  internal_error *piVar11;
  runtime_error *prVar12;
  char in_CL;
  bool bVar13;
  undefined7 in_register_00000011;
  iterator *this_00;
  _func_int **pp_Var14;
  slot_type *psVar15;
  array *this_01;
  array *this_02;
  size_t sVar16;
  aligned_type *paVar17;
  aligned_type *paVar18;
  tree_type<cs::token_base_*> *tree;
  _func_int **pp_Var19;
  slot_type *psVar20;
  slot_type *psVar21;
  var val;
  undefined1 local_110 [8];
  undefined1 local_108 [16];
  array arr;
  aligned_type *local_a8 [2];
  undefined1 local_98 [8];
  undefined1 local_90 [8];
  undefined1 local_88 [8];
  undefined1 local_80 [16];
  undefined1 local_70 [16];
  CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  aligned_type *local_50;
  undefined1 local_48 [8];
  slot_type *local_40;
  aligned_type *local_38;
  
  this_00 = (iterator *)CONCAT71(in_register_00000011,disable_parallel);
  this_02 = (array *)&val;
  local_108._8_8_ = it;
  if (this_00->mData == (tree_node *)0x0) {
    piVar11 = (internal_error *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string
              ((string *)&arr,"The expression tree is not available.",(allocator *)&val);
    internal_error::internal_error(piVar11,(string *)&arr);
    __cxa_throw(piVar11,&internal_error::typeinfo,internal_error::~internal_error);
  }
  pptVar7 = tree_type<cs::token_base_*>::iterator::data(this_00);
  ptVar1 = *pptVar7;
  if (ptVar1 == (token_base *)0x0) {
    (this->literals).
    super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
    .
    super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
    .ctrl_ = (ctrl_t *)0x0;
    return (var)(proxy *)this;
  }
  local_a8[1] = (aligned_type *)this;
  iVar6 = (*ptVar1->_vptr_token_base[2])(ptVar1);
  bVar13 = SUB81(&val,0);
  switch(iVar6) {
  case 3:
    break;
  case 4:
    pvVar9 = domain_manager::get_var
                       ((domain_manager *)
                        &(((callable *)(local_108._8_8_ + 0x20))->mFunc).super__Function_base.
                         _M_manager,(var_id *)(ptVar1 + 1));
    ppVar10 = pvVar9->mDat;
    goto LAB_002a60c8;
  case 5:
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string
              ((string *)&arr,"Wrong declaration of variable argument list.",(allocator *)&val);
    runtime_error::runtime_error(prVar12,(string *)&arr);
    __cxa_throw(prVar12,&runtime_error::typeinfo,runtime_error::~runtime_error);
  case 6:
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&arr,"Wrong expanding position.",(allocator *)&val);
    runtime_error::runtime_error(prVar12,(string *)&arr);
    __cxa_throw(prVar12,&runtime_error::typeinfo,runtime_error::~runtime_error);
  case 7:
    ppVar10 = (proxy *)ptVar1[1]._vptr_token_base;
LAB_002a60c8:
    if (ppVar10 != (proxy *)0x0) {
      ppVar10->refcount = ppVar10->refcount + 1;
    }
    (this->literals).
    super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
    .
    super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
    .ctrl_ = &ppVar10->is_rvalue;
    return (var)(proxy *)local_a8[1];
  case 8:
    get_string_literal(this,(string *)local_108._8_8_,(string *)(ptVar1 + 1));
    return (var)(proxy *)this;
  default:
switchD_002a5d8a_caseD_9:
    piVar11 = (internal_error *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&arr,"Unrecognized expression.",(allocator *)&val);
    internal_error::internal_error(piVar11,(string *)&arr);
    __cxa_throw(piVar11,&internal_error::typeinfo,internal_error::~internal_error);
  case 0xc:
    arr.super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
    super__Deque_impl_data._M_map = (_Map_pointer)ptVar1[1]._vptr_token_base;
    parse_expr(this,(iterator *)local_108._8_8_,SUB81(&arr,0));
    return (var)(proxy *)local_a8[1];
  case 0xe:
    std::_Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>::_Deque_base
              (&arr.super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>);
    paVar18 = (aligned_type *)ptVar1[2]._vptr_token_base;
    local_50 = (aligned_type *)ptVar1[3]._vptr_token_base;
    local_60.
    super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
    .
    super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0UL,_false>
    .value = (CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
              )ptVar1[3].line_num;
    paVar17 = (aligned_type *)ptVar1[4]._vptr_token_base;
    local_38 = paVar17;
    while (paVar18 != paVar17) {
      val.mDat = *(proxy **)&paVar18->__align;
      pptVar7 = tree_type<cs::token_base_*>::iterator::data((iterator *)&val);
      ptVar1 = *pptVar7;
      bVar13 = SUB81((EVP_PKEY_CTX *)local_108,0);
      if ((ptVar1 == (token_base *)0x0) ||
         (iVar6 = (*ptVar1->_vptr_token_base[2])(ptVar1), iVar6 != 6)) {
        local_108._0_8_ = paVar18->__align;
        parse_expr((runtime_type *)local_48,(iterator *)local_108._8_8_,bVar13);
        copy((EVP_PKEY_CTX *)&val,(EVP_PKEY_CTX *)local_48);
        std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::emplace_back<cs_impl::any>
                  (&arr,&val);
        cs_impl::any::recycle(&val);
        cs_impl::any::recycle((any *)local_48);
      }
      else {
        local_108._0_8_ = ptVar1[1]._vptr_token_base;
        parse_expr((runtime_type *)&val,(iterator *)local_108._8_8_,bVar13);
        pdVar8 = cs_impl::any::const_val<std::deque<cs_impl::any,std::allocator<cs_impl::any>>>
                           (&val);
        psVar20 = (slot_type *)
                  (pdVar8->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
                  super__Deque_impl_data._M_start._M_cur;
        psVar21 = (slot_type *)
                  (pdVar8->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
                  super__Deque_impl_data._M_start._M_last;
        local_58.
        super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
        .
        super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0UL,_false>
        .value = (CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
                  )(pdVar8->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
                   super__Deque_impl_data._M_start._M_node;
        psVar4 = (slot_type *)
                 (pdVar8->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
                 super__Deque_impl_data._M_finish._M_cur;
        while (psVar20 != psVar4) {
          local_40 = (slot_type *)(psVar20->_M_dataplus)._M_p;
          if (local_40 != (slot_type *)0x0) {
            (local_40->key)._M_string_length = (local_40->key)._M_string_length + 1;
          }
          copy((EVP_PKEY_CTX *)local_108,(EVP_PKEY_CTX *)&local_40);
          std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::emplace_back<cs_impl::any>
                    (&arr,(any *)local_108);
          cs_impl::any::recycle((any *)local_108);
          cs_impl::any::recycle((any *)&local_40);
          psVar20 = (slot_type *)&psVar20->_M_string_length;
          if (psVar20 == psVar21) {
            psVar20 = *(slot_type **)
                       ((long)local_58.
                              super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
                              .
                              super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0UL,_false>
                              .value + 8);
            local_58.
            super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
            .
            super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0UL,_false>
            .value = (CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
                      )((long)local_58.
                              super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
                              .
                              super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0UL,_false>
                              .value + 8);
            psVar21 = psVar20 + 0x10;
          }
        }
        cs_impl::any::recycle(&val);
        paVar17 = local_38;
      }
      paVar18 = (aligned_type *)(paVar18->__data + 8);
      if (paVar18 == local_50) {
        paVar18 = *(aligned_type **)
                   ((long)local_60.
                          super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
                          .
                          super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0UL,_false>
                          .value + 8);
        local_60.
        super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
        .
        super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0UL,_false>
        .value = (CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
                  )((long)local_60.
                          super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
                          .
                          super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0UL,_false>
                          .value + 8);
        local_50 = (aligned_type *)((long)paVar18 + 0x200);
      }
    }
    cs_impl::any::
    make<std::deque<cs_impl::any,std::allocator<cs_impl::any>>,std::deque<cs_impl::any,std::allocator<cs_impl::any>>>
              (&val,&arr);
    rvalue(&val);
    cs_impl::any::recycle(&val);
    std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::~deque(&arr);
    return (var)(proxy *)local_a8[1];
  case 0xf:
    if (in_CL == '\0') {
      (this->literals).
      super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
      .
      super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
      .ctrl_ = (ctrl_t *)0x0;
      pp_Var19 = ptVar1[2]._vptr_token_base;
      pp_Var14 = ptVar1[3]._vptr_token_base;
      sVar16 = ptVar1[3].line_num;
      pp_Var2 = ptVar1[4]._vptr_token_base;
      while (pp_Var19 != pp_Var2) {
        val.mDat = (proxy *)*pp_Var19;
        parse_expr((runtime_type *)&((aligned_type *)&arr)->__align,(iterator *)local_108._8_8_,
                   bVar13);
        if ((aligned_type *)&arr != (aligned_type *)local_a8[1]) {
          aVar3 = *(anon_struct_8_0_00000001_for___align *)local_a8[1];
          *(_Map_pointer *)local_a8[1] =
               arr.super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
               super__Deque_impl_data._M_map;
          arr.super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
          super__Deque_impl_data._M_map = (_Map_pointer)aVar3;
        }
        cs_impl::any::recycle((any *)&((aligned_type *)&arr)->__align);
        pp_Var19 = pp_Var19 + 1;
        if (pp_Var19 == pp_Var14) {
          pp_Var19 = *(_func_int ***)(sVar16 + 8);
          sVar16 = sVar16 + 8;
          pp_Var14 = pp_Var19 + 0x40;
        }
      }
      return (var)(proxy *)local_a8[1];
    }
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&arr,"Do not allowed parallel list.",(allocator *)&val);
    runtime_error::runtime_error(prVar12,(string *)&arr);
    __cxa_throw(prVar12,&runtime_error::typeinfo,runtime_error::~runtime_error);
  }
  switch(*(undefined4 *)&ptVar1[1]._vptr_token_base) {
  case 1:
    local_108._0_8_ = tree_type<cs::token_base_*>::iterator::left(this_00);
    psVar15 = (slot_type *)local_108._8_8_;
    parse_expr((runtime_type *)&val,(iterator *)local_108._8_8_,SUB81(local_108,0));
    local_a8[0] = (aligned_type *)tree_type<cs::token_base_*>::iterator::right(this_00);
    parse_expr((runtime_type *)local_110,(iterator *)&psVar15->value,SUB81(local_a8,0));
    parse_add((runtime_type *)&arr,(var *)&psVar15->value,&val);
    rvalue((var *)&arr);
    break;
  case 2:
    arr.super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
    super__Deque_impl_data._M_map =
         (_Map_pointer)tree_type<cs::token_base_*>::iterator::left(this_00);
    psVar15 = (slot_type *)local_108._8_8_;
    parse_expr((runtime_type *)(local_70 + 8),(iterator *)local_108._8_8_,SUB81(&arr,0));
    local_108._0_8_ = tree_type<cs::token_base_*>::iterator::right(this_00);
    parse_expr((runtime_type *)&val,(iterator *)&psVar15->value,SUB81(local_108,0));
    parse_addasi(this,(var *)&psVar15->value,(var *)(local_70 + 8));
    cs_impl::any::recycle(&val);
    this_02 = (array *)(local_70 + 8);
    goto LAB_002a6deb;
  case 3:
    local_108._0_8_ = tree_type<cs::token_base_*>::iterator::left(this_00);
    psVar15 = (slot_type *)local_108._8_8_;
    parse_expr((runtime_type *)&val,(iterator *)local_108._8_8_,SUB81(local_108,0));
    local_a8[0] = (aligned_type *)tree_type<cs::token_base_*>::iterator::right(this_00);
    parse_expr((runtime_type *)local_110,(iterator *)&psVar15->value,SUB81(local_a8,0));
    parse_sub((runtime_type *)&arr,(var *)&psVar15->value,&val);
    rvalue((var *)&arr);
    break;
  case 4:
    arr.super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
    super__Deque_impl_data._M_map =
         (_Map_pointer)tree_type<cs::token_base_*>::iterator::left(this_00);
    psVar15 = (slot_type *)local_108._8_8_;
    parse_expr((runtime_type *)local_70,(iterator *)local_108._8_8_,SUB81(&arr,0));
    local_108._0_8_ = tree_type<cs::token_base_*>::iterator::right(this_00);
    parse_expr((runtime_type *)&val,(iterator *)&psVar15->value,SUB81(local_108,0));
    parse_subasi(this,(var *)&psVar15->value,(var *)local_70);
    cs_impl::any::recycle(&val);
    this_02 = (array *)local_70;
    goto LAB_002a6deb;
  case 5:
    local_108._0_8_ = tree_type<cs::token_base_*>::iterator::left(this_00);
    psVar15 = (slot_type *)local_108._8_8_;
    parse_expr((runtime_type *)&val,(iterator *)local_108._8_8_,SUB81(local_108,0));
    local_a8[0] = (aligned_type *)tree_type<cs::token_base_*>::iterator::right(this_00);
    parse_expr((runtime_type *)local_110,(iterator *)&psVar15->value,SUB81(local_a8,0));
    parse_mul((runtime_type *)&arr,(var *)&psVar15->value,&val);
    rvalue((var *)&arr);
    break;
  case 6:
    arr.super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
    super__Deque_impl_data._M_map =
         (_Map_pointer)tree_type<cs::token_base_*>::iterator::left(this_00);
    psVar15 = (slot_type *)local_108._8_8_;
    parse_expr((runtime_type *)(local_80 + 8),(iterator *)local_108._8_8_,SUB81(&arr,0));
    local_108._0_8_ = tree_type<cs::token_base_*>::iterator::right(this_00);
    parse_expr((runtime_type *)&val,(iterator *)&psVar15->value,SUB81(local_108,0));
    parse_mulasi(this,(var *)&psVar15->value,(var *)(local_80 + 8));
    cs_impl::any::recycle(&val);
    this_02 = (array *)(local_80 + 8);
    goto LAB_002a6deb;
  case 7:
    local_108._0_8_ = tree_type<cs::token_base_*>::iterator::left(this_00);
    psVar15 = (slot_type *)local_108._8_8_;
    parse_expr((runtime_type *)&val,(iterator *)local_108._8_8_,SUB81(local_108,0));
    local_a8[0] = (aligned_type *)tree_type<cs::token_base_*>::iterator::right(this_00);
    parse_expr((runtime_type *)local_110,(iterator *)&psVar15->value,SUB81(local_a8,0));
    parse_div((runtime_type *)&arr,(var *)&psVar15->value,&val);
    rvalue((var *)&arr);
    break;
  case 8:
    arr.super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
    super__Deque_impl_data._M_map =
         (_Map_pointer)tree_type<cs::token_base_*>::iterator::left(this_00);
    psVar15 = (slot_type *)local_108._8_8_;
    parse_expr((runtime_type *)local_80,(iterator *)local_108._8_8_,SUB81(&arr,0));
    local_108._0_8_ = tree_type<cs::token_base_*>::iterator::right(this_00);
    parse_expr((runtime_type *)&val,(iterator *)&psVar15->value,SUB81(local_108,0));
    parse_divasi(this,(var *)&psVar15->value,(var *)local_80);
    cs_impl::any::recycle(&val);
    this_02 = (array *)local_80;
    goto LAB_002a6deb;
  case 9:
    local_108._0_8_ = tree_type<cs::token_base_*>::iterator::left(this_00);
    psVar15 = (slot_type *)local_108._8_8_;
    parse_expr((runtime_type *)&val,(iterator *)local_108._8_8_,SUB81(local_108,0));
    local_a8[0] = (aligned_type *)tree_type<cs::token_base_*>::iterator::right(this_00);
    parse_expr((runtime_type *)local_110,(iterator *)&psVar15->value,SUB81(local_a8,0));
    parse_mod((runtime_type *)&arr,(var *)&psVar15->value,&val);
    rvalue((var *)&arr);
    break;
  case 10:
    arr.super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
    super__Deque_impl_data._M_map =
         (_Map_pointer)tree_type<cs::token_base_*>::iterator::left(this_00);
    psVar15 = (slot_type *)local_108._8_8_;
    parse_expr((runtime_type *)local_88,(iterator *)local_108._8_8_,SUB81(&arr,0));
    local_108._0_8_ = tree_type<cs::token_base_*>::iterator::right(this_00);
    parse_expr((runtime_type *)&val,(iterator *)&psVar15->value,SUB81(local_108,0));
    parse_modasi(this,(var *)&psVar15->value,(var *)local_88);
    cs_impl::any::recycle(&val);
    this_02 = (array *)local_88;
    goto LAB_002a6deb;
  case 0xb:
    local_108._0_8_ = tree_type<cs::token_base_*>::iterator::left(this_00);
    psVar15 = (slot_type *)local_108._8_8_;
    parse_expr((runtime_type *)&val,(iterator *)local_108._8_8_,SUB81(local_108,0));
    local_a8[0] = (aligned_type *)tree_type<cs::token_base_*>::iterator::right(this_00);
    parse_expr((runtime_type *)local_110,(iterator *)&psVar15->value,SUB81(local_a8,0));
    parse_pow((runtime_type *)&arr,(var *)&psVar15->value,&val);
    rvalue((var *)&arr);
    break;
  case 0xc:
    arr.super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
    super__Deque_impl_data._M_map =
         (_Map_pointer)tree_type<cs::token_base_*>::iterator::left(this_00);
    psVar15 = (slot_type *)local_108._8_8_;
    parse_expr((runtime_type *)local_90,(iterator *)local_108._8_8_,SUB81(&arr,0));
    local_108._0_8_ = tree_type<cs::token_base_*>::iterator::right(this_00);
    parse_expr((runtime_type *)&val,(iterator *)&psVar15->value,SUB81(local_108,0));
    parse_powasi(this,(var *)&psVar15->value,(var *)local_90);
    cs_impl::any::recycle(&val);
    this_02 = (array *)local_90;
    goto LAB_002a6deb;
  default:
    goto switchD_002a5d8a_caseD_9;
  case 0xe:
    val.mDat = (proxy *)tree_type<cs::token_base_*>::iterator::left(this_00);
    parse_expr((runtime_type *)&arr,(iterator *)local_108._8_8_,bVar13);
    local_108._0_8_ = tree_type<cs::token_base_*>::iterator::right(this_00);
    tree_type<cs::token_base_*>::iterator::data((iterator *)local_108);
    parse_dot(this,(var *)local_108._8_8_,(token_base *)&arr);
    goto LAB_002a6de6;
  case 0xf:
    local_108._0_8_ = tree_type<cs::token_base_*>::iterator::left(this_00);
    psVar15 = (slot_type *)local_108._8_8_;
    parse_expr((runtime_type *)&val,(iterator *)local_108._8_8_,SUB81(local_108,0));
    local_a8[0] = (aligned_type *)tree_type<cs::token_base_*>::iterator::right(this_00);
    parse_expr((runtime_type *)local_110,(iterator *)&psVar15->value,SUB81(local_a8,0));
    parse_und((runtime_type *)&arr,(var *)&psVar15->value,&val);
    rvalue((var *)&arr);
    break;
  case 0x10:
    local_108._0_8_ = tree_type<cs::token_base_*>::iterator::left(this_00);
    psVar15 = (slot_type *)local_108._8_8_;
    parse_expr((runtime_type *)&val,(iterator *)local_108._8_8_,SUB81(local_108,0));
    local_a8[0] = (aligned_type *)tree_type<cs::token_base_*>::iterator::right(this_00);
    parse_expr((runtime_type *)local_110,(iterator *)&psVar15->value,SUB81(local_a8,0));
    parse_abo((runtime_type *)&arr,(var *)&psVar15->value,&val);
    rvalue((var *)&arr);
    break;
  case 0x11:
    arr.super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
    super__Deque_impl_data._M_map =
         (_Map_pointer)tree_type<cs::token_base_*>::iterator::left(this_00);
    psVar15 = (slot_type *)local_108._8_8_;
    parse_expr((runtime_type *)local_98,(iterator *)local_108._8_8_,SUB81(&arr,0));
    local_108._0_8_ = tree_type<cs::token_base_*>::iterator::right(this_00);
    parse_expr((runtime_type *)&val,(iterator *)&psVar15->value,SUB81(local_108,0));
    parse_asi(this,(var *)&psVar15->value,(var *)local_98);
    cs_impl::any::recycle(&val);
    this_02 = (array *)local_98;
    goto LAB_002a6deb;
  case 0x12:
    b = tree_type<cs::token_base_*>::iterator::left(this_00);
    val.mDat = (proxy *)tree_type<cs::token_base_*>::iterator::right(this_00);
    uVar5 = local_108._8_8_;
    parse_expr((runtime_type *)&arr,(iterator *)local_108._8_8_,bVar13);
    parse_lnkasi(this,(iterator)uVar5,(var *)b.mData);
    goto LAB_002a6de6;
  case 0x13:
    local_108._0_8_ = tree_type<cs::token_base_*>::iterator::left(this_00);
    psVar15 = (slot_type *)local_108._8_8_;
    parse_expr((runtime_type *)&val,(iterator *)local_108._8_8_,SUB81(local_108,0));
    local_a8[0] = (aligned_type *)tree_type<cs::token_base_*>::iterator::right(this_00);
    parse_expr((runtime_type *)local_110,(iterator *)&psVar15->value,SUB81(local_a8,0));
    parse_equ((runtime_type *)&arr,(var *)&psVar15->value,&val);
    rvalue((var *)&arr);
    break;
  case 0x14:
    local_108._0_8_ = tree_type<cs::token_base_*>::iterator::left(this_00);
    psVar15 = (slot_type *)local_108._8_8_;
    parse_expr((runtime_type *)&val,(iterator *)local_108._8_8_,SUB81(local_108,0));
    local_a8[0] = (aligned_type *)tree_type<cs::token_base_*>::iterator::right(this_00);
    parse_expr((runtime_type *)local_110,(iterator *)&psVar15->value,SUB81(local_a8,0));
    parse_ueq((runtime_type *)&arr,(var *)&psVar15->value,&val);
    rvalue((var *)&arr);
    break;
  case 0x15:
    local_108._0_8_ = tree_type<cs::token_base_*>::iterator::left(this_00);
    psVar15 = (slot_type *)local_108._8_8_;
    parse_expr((runtime_type *)&val,(iterator *)local_108._8_8_,SUB81(local_108,0));
    local_a8[0] = (aligned_type *)tree_type<cs::token_base_*>::iterator::right(this_00);
    parse_expr((runtime_type *)local_110,(iterator *)&psVar15->value,SUB81(local_a8,0));
    parse_aeq((runtime_type *)&arr,(var *)&psVar15->value,&val);
    rvalue((var *)&arr);
    break;
  case 0x16:
    local_108._0_8_ = tree_type<cs::token_base_*>::iterator::left(this_00);
    psVar15 = (slot_type *)local_108._8_8_;
    parse_expr((runtime_type *)&val,(iterator *)local_108._8_8_,SUB81(local_108,0));
    local_a8[0] = (aligned_type *)tree_type<cs::token_base_*>::iterator::right(this_00);
    parse_expr((runtime_type *)local_110,(iterator *)&psVar15->value,SUB81(local_a8,0));
    parse_neq((runtime_type *)&arr,(var *)&psVar15->value,&val);
    rvalue((var *)&arr);
    break;
  case 0x17:
    val.mDat = (proxy *)tree_type<cs::token_base_*>::iterator::left(this_00);
    local_108._0_8_ = tree_type<cs::token_base_*>::iterator::right(this_00);
    parse_and((runtime_type *)&arr,(iterator *)local_108._8_8_,(iterator *)&val);
    rvalue((var *)&arr);
    goto LAB_002a6de6;
  case 0x18:
    val.mDat = (proxy *)tree_type<cs::token_base_*>::iterator::left(this_00);
    local_108._0_8_ = tree_type<cs::token_base_*>::iterator::right(this_00);
    parse_or((runtime_type *)&arr,(iterator *)local_108._8_8_,(iterator *)&val);
    rvalue((var *)&arr);
    goto LAB_002a6de6;
  case 0x19:
    local_108._0_8_ = tree_type<cs::token_base_*>::iterator::right(this_00);
    psVar15 = (slot_type *)local_108._8_8_;
    parse_expr((runtime_type *)&val,(iterator *)local_108._8_8_,SUB81(local_108,0));
    parse_not((runtime_type *)&arr,(var *)&psVar15->value);
    rvalue((var *)&arr);
    goto LAB_002a6c27;
  case 0x1a:
    val.mDat = (proxy *)tree_type<cs::token_base_*>::iterator::left(this_00);
    psVar15 = (slot_type *)local_108._8_8_;
    parse_expr((runtime_type *)&arr,(iterator *)local_108._8_8_,bVar13);
    local_110 = (undefined1  [8])tree_type<cs::token_base_*>::iterator::right(this_00);
    parse_expr((runtime_type *)local_108,(iterator *)&psVar15->value,SUB81(local_110,0));
    parse_inc(this,(var *)&psVar15->value,(var *)&arr);
    goto LAB_002a6ddc;
  case 0x1b:
    val.mDat = (proxy *)tree_type<cs::token_base_*>::iterator::left(this_00);
    psVar15 = (slot_type *)local_108._8_8_;
    parse_expr((runtime_type *)&arr,(iterator *)local_108._8_8_,bVar13);
    local_110 = (undefined1  [8])tree_type<cs::token_base_*>::iterator::right(this_00);
    parse_expr((runtime_type *)local_108,(iterator *)&psVar15->value,SUB81(local_110,0));
    parse_dec(this,(var *)&psVar15->value,(var *)&arr);
    goto LAB_002a6ddc;
  case 0x1c:
    local_108._0_8_ = tree_type<cs::token_base_*>::iterator::left(this_00);
    psVar15 = (slot_type *)local_108._8_8_;
    parse_expr((runtime_type *)&val,(iterator *)local_108._8_8_,SUB81(local_108,0));
    local_a8[0] = (aligned_type *)tree_type<cs::token_base_*>::iterator::right(this_00);
    parse_expr((runtime_type *)local_110,(iterator *)&psVar15->value,SUB81(local_a8,0));
    parse_pair((runtime_type *)&arr,(var *)&psVar15->value,&val);
    rvalue((var *)&arr);
    break;
  case 0x1d:
    val.mDat = (proxy *)tree_type<cs::token_base_*>::iterator::left(this_00);
    uVar5 = local_108._8_8_;
    parse_expr((runtime_type *)&arr,(iterator *)local_108._8_8_,bVar13);
    local_108._0_8_ = tree_type<cs::token_base_*>::iterator::right(this_00);
    parse_choice(this,(var *)uVar5,(iterator *)&arr);
    goto LAB_002a6de6;
  case 0x27:
    val.mDat = (proxy *)tree_type<cs::token_base_*>::iterator::left(this_00);
    parse_expr((runtime_type *)&arr,(iterator *)local_108._8_8_,bVar13);
    local_108._0_8_ = tree_type<cs::token_base_*>::iterator::right(this_00);
    tree_type<cs::token_base_*>::iterator::data((iterator *)local_108);
    parse_fcall(this,(var *)local_108._8_8_,(token_base *)&arr);
    goto LAB_002a6de6;
  case 0x28:
    val.mDat = (proxy *)tree_type<cs::token_base_*>::iterator::left(this_00);
    psVar15 = (slot_type *)local_108._8_8_;
    parse_expr((runtime_type *)&arr,(iterator *)local_108._8_8_,bVar13);
    local_110 = (undefined1  [8])tree_type<cs::token_base_*>::iterator::right(this_00);
    parse_expr((runtime_type *)local_108,(iterator *)&psVar15->value,SUB81(local_110,0));
    parse_access(this,(var *)&psVar15->value,(var *)&arr);
LAB_002a6ddc:
    cs_impl::any::recycle((any *)local_108);
    goto LAB_002a6de6;
  case 0x29:
    local_108._0_8_ = tree_type<cs::token_base_*>::iterator::right(this_00);
    psVar15 = (slot_type *)local_108._8_8_;
    parse_expr((runtime_type *)&val,(iterator *)local_108._8_8_,SUB81(local_108,0));
    parse_typeid((runtime_type *)&arr,(var *)&psVar15->value);
    rvalue((var *)&arr);
    goto LAB_002a6c27;
  case 0x2a:
    local_108._0_8_ = tree_type<cs::token_base_*>::iterator::right(this_00);
    parse_expr((runtime_type *)&val,(iterator *)local_108._8_8_,SUB81(local_108,0));
    cs_impl::any::make<cs::pointer,cs_impl::any_const&>((any *)&arr,&val);
    rvalue((var *)&arr);
    goto LAB_002a6c27;
  case 0x2b:
    local_108._0_8_ = tree_type<cs::token_base_*>::iterator::right(this_00);
    psVar15 = (slot_type *)local_108._8_8_;
    parse_expr((runtime_type *)&val,(iterator *)local_108._8_8_,SUB81(local_108,0));
    parse_new((runtime_type *)&arr,(var *)&psVar15->value);
    rvalue((var *)&arr);
    goto LAB_002a6c27;
  case 0x2c:
    local_108._0_8_ = tree_type<cs::token_base_*>::iterator::right(this_00);
    psVar15 = (slot_type *)local_108._8_8_;
    parse_expr((runtime_type *)&val,(iterator *)local_108._8_8_,SUB81(local_108,0));
    parse_gcnew((runtime_type *)&arr,(var *)&psVar15->value);
    rvalue((var *)&arr);
    goto LAB_002a6c27;
  case 0x2d:
    val.mDat = (proxy *)tree_type<cs::token_base_*>::iterator::left(this_00);
    parse_expr((runtime_type *)&arr,(iterator *)local_108._8_8_,bVar13);
    local_108._0_8_ = tree_type<cs::token_base_*>::iterator::right(this_00);
    tree_type<cs::token_base_*>::iterator::data((iterator *)local_108);
    parse_arrow(this,(var *)local_108._8_8_,(token_base *)&arr);
    goto LAB_002a6de6;
  case 0x2f:
    val.mDat = (proxy *)tree_type<cs::token_base_*>::iterator::right(this_00);
    psVar15 = (slot_type *)local_108._8_8_;
    parse_expr((runtime_type *)&arr,(iterator *)local_108._8_8_,bVar13);
    parse_escape(this,(var *)&psVar15->value);
LAB_002a6de6:
    this_02 = &arr;
    goto LAB_002a6deb;
  case 0x30:
    local_108._0_8_ = tree_type<cs::token_base_*>::iterator::right(this_00);
    psVar15 = (slot_type *)local_108._8_8_;
    parse_expr((runtime_type *)&val,(iterator *)local_108._8_8_,SUB81(local_108,0));
    parse_minus((runtime_type *)&arr,(var *)&psVar15->value);
    rvalue((var *)&arr);
LAB_002a6c27:
    this_01 = &arr;
    goto LAB_002a6c9d;
  case 0x35:
    arr.super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
    super__Deque_impl_data._M_map =
         (_Map_pointer)tree_type<cs::token_base_*>::iterator::left(this_00);
    pptVar7 = tree_type<cs::token_base_*>::iterator::data((iterator *)&arr);
    ptVar1 = *pptVar7;
    local_108._0_8_ = tree_type<cs::token_base_*>::iterator::right(this_00);
    uVar5 = local_108._8_8_;
    parse_expr((runtime_type *)&val,(iterator *)local_108._8_8_,SUB81(local_108,0));
    parse_bind(this,(token_base *)uVar5,(var *)ptVar1);
    this_02 = (array *)&val;
    goto LAB_002a6deb;
  }
  cs_impl::any::recycle((any *)&arr);
  this_01 = (array *)local_110;
LAB_002a6c9d:
  cs_impl::any::recycle((any *)this_01);
LAB_002a6deb:
  cs_impl::any::recycle((any *)this_02);
  return (var)(proxy *)local_a8[1];
}

Assistant:

var runtime_type::parse_expr(const tree_type<token_base *>::iterator &it, bool disable_parallel)
	{
		if (!it.usable())
			throw internal_error("The expression tree is not available.");
		token_base *token = it.data();
		if (token == nullptr)
			return var();
		switch (token->get_type()) {
		default:
			break;
		case token_types::vargs:
			throw runtime_error("Wrong declaration of variable argument list.");
			break;
		case token_types::expand:
			throw runtime_error("Wrong expanding position.");
			break;
		case token_types::id:
			return storage.get_var(static_cast<token_id *>(token)->get_id());
			break;
		case token_types::literal: {
			token_literal *ptr = static_cast<token_literal *>(token);
			return get_string_literal(ptr->get_data(), ptr->get_literal());
		}
		case token_types::value:
			return static_cast<token_value *>(token)->get_value();
			break;
		case token_types::expr:
			return parse_expr(static_cast<token_expr *>(token)->get_tree().root());
			break;
		case token_types::array: {
			array arr;
			token_base *ptr = nullptr;
			for (auto &tree: static_cast<token_array *>(token)->get_array()) {
				ptr = tree.root().data();
				if (ptr != nullptr && ptr->get_type() == token_types::expand) {
					var val = parse_expr(static_cast<token_expand *>(ptr)->get_tree().root());
					const auto &child_arr = val.const_val<array>();
					for (auto &it: child_arr)
						arr.push_back(copy(it));
				}
				else
					arr.push_back(copy(parse_expr(tree.root())));
			}
			return rvalue(var::make<array>(std::move(arr)));
		}
		case token_types::parallel: {
			if (disable_parallel)
				throw runtime_error("Do not allowed parallel list.");
			var result;
			for (auto &tree: static_cast<token_parallel *>(token)->get_parallel())
				result = parse_expr(tree.root());
			return result;
		}
		case token_types::signal: {
			switch (static_cast<token_signal *>(token)->get_signal()) {
			default:
				break;
			case signal_types::add_:
				return rvalue(parse_add(parse_expr(it.left()), parse_expr(it.right())));
				break;
			case signal_types::addasi_:
				return parse_addasi(parse_expr(it.left()), parse_expr(it.right()));
				break;
			case signal_types::sub_:
				return rvalue(parse_sub(parse_expr(it.left()), parse_expr(it.right())));
				break;
			case signal_types::subasi_:
				return parse_subasi(parse_expr(it.left()), parse_expr(it.right()));
				break;
			case signal_types::minus_:
				return rvalue(parse_minus(parse_expr(it.right())));
				break;
			case signal_types::mul_:
				return rvalue(parse_mul(parse_expr(it.left()), parse_expr(it.right())));
				break;
			case signal_types::mulasi_:
				return parse_mulasi(parse_expr(it.left()), parse_expr(it.right()));
				break;
			case signal_types::escape_:
				return parse_escape(parse_expr(it.right()));
				break;
			case signal_types::div_:
				return rvalue(parse_div(parse_expr(it.left()), parse_expr(it.right())));
				break;
			case signal_types::divasi_:
				return parse_divasi(parse_expr(it.left()), parse_expr(it.right()));
				break;
			case signal_types::mod_:
				return rvalue(parse_mod(parse_expr(it.left()), parse_expr(it.right())));
				break;
			case signal_types::modasi_:
				return parse_modasi(parse_expr(it.left()), parse_expr(it.right()));
				break;
			case signal_types::pow_:
				return rvalue(parse_pow(parse_expr(it.left()), parse_expr(it.right())));
				break;
			case signal_types::powasi_:
				return parse_powasi(parse_expr(it.left()), parse_expr(it.right()));
				break;
			case signal_types::dot_:
				return parse_dot(parse_expr(it.left()), it.right().data());
				break;
			case signal_types::arrow_:
				return parse_arrow(parse_expr(it.left()), it.right().data());
				break;
			case signal_types::typeid_:
				return rvalue(parse_typeid(parse_expr(it.right())));
				break;
			case signal_types::new_:
				return rvalue(parse_new(parse_expr(it.right())));
				break;
			case signal_types::gcnew_:
				return rvalue(parse_gcnew(parse_expr(it.right())));
				break;
			case signal_types::und_:
				return rvalue(parse_und(parse_expr(it.left()), parse_expr(it.right())));
				break;
			case signal_types::abo_:
				return rvalue(parse_abo(parse_expr(it.left()), parse_expr(it.right())));
				break;
			case signal_types::asi_:
				return parse_asi(parse_expr(it.left()), parse_expr(it.right()));
				break;
			case signal_types::lnkasi_:
				return parse_lnkasi(it.left(), parse_expr(it.right()));
				break;
			case signal_types::bind_:
				return parse_bind(it.left().data(), parse_expr(it.right()));
				break;
			case signal_types::choice_:
				return parse_choice(parse_expr(it.left()), it.right());
				break;
			case signal_types::pair_:
				return rvalue(parse_pair(parse_expr(it.left()), parse_expr(it.right())));
				break;
			case signal_types::equ_:
				return rvalue(parse_equ(parse_expr(it.left()), parse_expr(it.right())));
				break;
			case signal_types::ueq_:
				return rvalue(parse_ueq(parse_expr(it.left()), parse_expr(it.right())));
				break;
			case signal_types::aeq_:
				return rvalue(parse_aeq(parse_expr(it.left()), parse_expr(it.right())));
				break;
			case signal_types::neq_:
				return rvalue(parse_neq(parse_expr(it.left()), parse_expr(it.right())));
				break;
			case signal_types::and_:
				return rvalue(parse_and(it.left(), it.right()));
				break;
			case signal_types::or_:
				return rvalue(parse_or(it.left(), it.right()));
				break;
			case signal_types::not_:
				return rvalue(parse_not(parse_expr(it.right())));
				break;
			case signal_types::inc_:
				return parse_inc(parse_expr(it.left()), parse_expr(it.right()));
				break;
			case signal_types::dec_:
				return parse_dec(parse_expr(it.left()), parse_expr(it.right()));
				break;
			case signal_types::addr_:
				return rvalue(parse_addr(parse_expr(it.right())));
				break;
			case signal_types::fcall_:
				return parse_fcall(parse_expr(it.left()), it.right().data());
				break;
			case signal_types::access_:
				return parse_access(parse_expr(it.left()), parse_expr(it.right()));
				break;
			}
		}
		}
		throw internal_error("Unrecognized expression.");
	}